

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_init_verify_certificate(ptls_openssl_verify_certificate_t *self,X509_STORE *store)

{
  X509_STORE *pXVar1;
  X509_STORE *store_local;
  ptls_openssl_verify_certificate_t *self_local;
  
  (self->super).cb = verify_cert;
  (self->super).algos = default_signature_schemes;
  self->cert_store = (X509_STORE *)0x0;
  self->override_callback = (ptls_openssl_override_verify_certificate_t *)0x0;
  if (store == (X509_STORE *)0x0) {
    pXVar1 = ptls_openssl_create_default_certificate_store();
    self->cert_store = pXVar1;
    if (pXVar1 == (X509_STORE *)0x0) {
      return -1;
    }
  }
  else {
    X509_STORE_up_ref(store);
    self->cert_store = store;
  }
  return 0;
}

Assistant:

int ptls_openssl_init_verify_certificate(ptls_openssl_verify_certificate_t *self, X509_STORE *store)
{
    *self = (ptls_openssl_verify_certificate_t){{verify_cert, default_signature_schemes}, NULL};

    if (store != NULL) {
        X509_STORE_up_ref(store);
        self->cert_store = store;
    } else {
        /* use default store */
        if ((self->cert_store = ptls_openssl_create_default_certificate_store()) == NULL)
            return -1;
    }

    return 0;
}